

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestLog.cpp
# Opt level: O0

void __thiscall
tcu::TestLog::writeValueInfo
          (TestLog *this,string *name,string *description,string *unit,qpSampleValueTag tag)

{
  qpTestLog *log;
  deBool dVar1;
  char *name_00;
  char *description_00;
  ulong uVar2;
  LogWriteFailedError *this_00;
  char *local_60;
  qpSampleValueTag tag_local;
  string *unit_local;
  string *description_local;
  string *name_local;
  TestLog *this_local;
  
  log = this->m_log;
  name_00 = (char *)std::__cxx11::string::c_str();
  description_00 = (char *)std::__cxx11::string::c_str();
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    local_60 = (char *)std::__cxx11::string::c_str();
  }
  else {
    local_60 = (char *)0x0;
  }
  dVar1 = qpTestLog_writeValueInfo(log,name_00,description_00,local_60,tag);
  if (dVar1 == 0) {
    this_00 = (LogWriteFailedError *)__cxa_allocate_exception(0x38);
    LogWriteFailedError::LogWriteFailedError(this_00);
    __cxa_throw(this_00,&LogWriteFailedError::typeinfo,LogWriteFailedError::~LogWriteFailedError);
  }
  return;
}

Assistant:

void TestLog::writeValueInfo (const std::string& name, const std::string& description, const std::string& unit, qpSampleValueTag tag)
{
	if (qpTestLog_writeValueInfo(m_log, name.c_str(), description.c_str(), unit.empty() ? DE_NULL : unit.c_str(), tag) == DE_FALSE)
		throw LogWriteFailedError();
}